

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

void __thiscall Camera::move_right(Camera *this,float delta_time)

{
  float fVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  vVar2 = glm::operator*(&this->right,delta_time);
  fVar1 = this->speed;
  local_18.field_2.z = fVar1 * vVar2.field_2.z;
  local_18.field_1.y = fVar1 * vVar2.field_1.y;
  local_18.field_0.x = fVar1 * vVar2.field_0.x;
  glm::vec<3,float,(glm::qualifier)0>::operator+=((vec<3,float,(glm::qualifier)0> *)this,&local_18);
  return;
}

Assistant:

void Camera::move_right(float delta_time) {
    position += right * delta_time * speed;
}